

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman.cpp
# Opt level: O3

void __thiscall CHuffman::Setbits_r(CHuffman *this,CNode *pNode,int Bits,uint Depth)

{
  if (pNode->m_aLeafs[1] != 0xffff) {
    Setbits_r(this,this->m_aNodes + pNode->m_aLeafs[1],Bits | 1 << (Depth & 0x1f),Depth + 1);
  }
  if (pNode->m_aLeafs[0] != 0xffff) {
    Setbits_r(this,this->m_aNodes + pNode->m_aLeafs[0],Bits,Depth + 1);
  }
  if (pNode->m_NumBits != 0) {
    pNode->m_Bits = Bits;
    pNode->m_NumBits = Depth;
  }
  return;
}

Assistant:

void CHuffman::Setbits_r(CNode *pNode, int Bits, unsigned Depth)
{
	if(pNode->m_aLeafs[1] != 0xffff)
		Setbits_r(&m_aNodes[pNode->m_aLeafs[1]], Bits|(1<<Depth), Depth+1);
	if(pNode->m_aLeafs[0] != 0xffff)
		Setbits_r(&m_aNodes[pNode->m_aLeafs[0]], Bits, Depth+1);

	if(pNode->m_NumBits)
	{
		pNode->m_Bits = Bits;
		pNode->m_NumBits = Depth;
	}
}